

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gvar2.c
# Opt level: O0

LispPTR N_OP_rplptr(LispPTR tos_m_1,LispPTR tos,uint alpha)

{
  LispPTR *pLVar1;
  xpointer *pslot;
  uint alpha_local;
  LispPTR tos_local;
  LispPTR tos_m_1_local;
  
  pLVar1 = NativeAligned4FromLAddr(tos_m_1 + alpha);
  if (((*(ushort *)((ulong)(MDStypetbl + (tos >> 9)) ^ 2) & 0x8000) == 0) &&
     (*GcDisabled_word != 0x4c)) {
    if (*Reclaim_cnt_word == 0) {
      rec_htfind(tos,0);
    }
    else {
      htfind(tos,0);
    }
  }
  if (((*(ushort *)((ulong)(MDStypetbl + ((int)(*pLVar1 & 0xfffffff) >> 9)) ^ 2) & 0x8000) == 0) &&
     (*GcDisabled_word != 0x4c)) {
    if (*Reclaim_cnt_word == 0) {
      rec_htfind(*pLVar1 & 0xfffffff,1);
    }
    else {
      htfind(*pLVar1 & 0xfffffff,1);
    }
  }
  *pLVar1 = *pLVar1 & 0xf0000000 | tos & 0xfffffff;
  return tos_m_1;
}

Assistant:

LispPTR N_OP_rplptr(LispPTR tos_m_1, LispPTR tos, unsigned int alpha) {
  struct xpointer *pslot;

  pslot = (struct xpointer *)NativeAligned4FromLAddr(tos_m_1 + alpha);
  FRPLPTR(pslot->addr, tos);
  return (tos_m_1);
}